

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManRefinePrint(Ga2_Man_t *p,Vec_Int_t *vVec)

{
  int iVar1;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  puts("\n         Unsat core: ");
  if (0 < vVec->nSize) {
    uVar7 = 0;
    do {
      iVar1 = vVec->pArray[uVar7];
      if (((long)iVar1 < 0) || (p_00 = p->pGia, p_00->nObjs <= iVar1)) {
LAB_005fd0c2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar3 = p_00->pObjs + iVar1;
      Ga2_ObjLeaves(p_00,pGVar3);
      printf("%12d : ",uVar7 & 0xffffffff);
      pGVar2 = p->pGia->pObjs;
      if ((pGVar3 < pGVar2) || (pGVar2 + p->pGia->nObjs <= pGVar3)) {
LAB_005fd0a3:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      printf("Obj =%6d ",
             (ulong)(uint)((int)((ulong)((long)pGVar3 - (long)pGVar2) >> 2) * -0x55555555));
      if ((((uint)*(undefined8 *)pGVar3 & 0x9fffffff) != 0x9fffffff) ||
         (pcVar4 = "ff ",
         (int)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff) <
         p->pGia->vCis->nSize - p->pGia->nRegs)) {
        pcVar4 = "   ";
      }
      printf(pcVar4);
      pGVar2 = p->pGia->pObjs;
      if ((pGVar3 < pGVar2) || (pGVar2 + p->pGia->nObjs <= pGVar3)) goto LAB_005fd0a3;
      uVar5 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
      if (((int)uVar5 < 0) || (p->vIds->nSize <= (int)uVar5)) {
LAB_005fd0e1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vIds->pArray[uVar5 & 0x7fffffff];
      if (iVar1 < 0) {
LAB_005fd100:
        __assert_fail("Ga2_ObjId(p,pObj) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                      ,0x5a,"int Ga2_ObjIsAbs0(Ga2_Man_t *, Gia_Obj_t *)");
      }
      pcVar4 = "a ";
      if ((p->LimAbs <= iVar1) && (pcVar4 = "  ", iVar1 < p->LimPpi)) {
        pcVar4 = "l ";
      }
      printf(pcVar4);
      printf("Fanins: ");
      if (0 < Ga2_ObjLeaves::v.nSize) {
        lVar6 = 0;
        do {
          iVar1 = Ga2_ObjLeaves::v.pArray[lVar6];
          if (((long)iVar1 < 0) || (p->pGia->nObjs <= iVar1)) goto LAB_005fd0c2;
          pGVar3 = p->pGia->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          pGVar3 = pGVar3 + iVar1;
          printf("%6d ");
          if ((((uint)*(undefined8 *)pGVar3 & 0x9fffffff) != 0x9fffffff) ||
             (pcVar4 = "ff ",
             (int)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff) <
             p->pGia->vCis->nSize - p->pGia->nRegs)) {
            pcVar4 = "   ";
          }
          printf(pcVar4);
          pGVar2 = p->pGia->pObjs;
          if ((pGVar3 < pGVar2) || (pGVar2 + p->pGia->nObjs <= pGVar3)) goto LAB_005fd0a3;
          uVar5 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
          if (((int)uVar5 < 0) || (p->vIds->nSize <= (int)uVar5)) goto LAB_005fd0e1;
          iVar1 = p->vIds->pArray[uVar5 & 0x7fffffff];
          if (iVar1 < 0) goto LAB_005fd100;
          pcVar4 = "a ";
          if ((p->LimAbs <= iVar1) && (pcVar4 = "l ", p->LimPpi <= iVar1)) {
            pcVar4 = "  ";
          }
          printf(pcVar4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < Ga2_ObjLeaves::v.nSize);
      }
      putchar(10);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vVec->nSize);
  }
  return;
}

Assistant:

void Ga2_ManRefinePrint( Ga2_Man_t * p, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    printf( "\n         Unsat core: \n" );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
    {
        Vec_Int_t * vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        printf( "%12d : ", i );
        printf( "Obj =%6d ", Gia_ObjId(p->pGia, pObj) );
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            printf( "ff " );
        else
            printf( "   " );
        if ( Ga2_ObjIsAbs0(p, pObj) )
            printf( "a " );
        else if ( Ga2_ObjIsLeaf0(p, pObj) )
            printf( "l " );
        else 
            printf( "  " );
        printf( "Fanins: " );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pFanin, k )
        {
            printf( "%6d ", Gia_ObjId(p->pGia, pFanin) );
            if ( Gia_ObjIsRo(p->pGia, pFanin) )
                printf( "ff " );
            else
                printf( "   " );
            if ( Ga2_ObjIsAbs0(p, pFanin) )
                printf( "a " );
            else if ( Ga2_ObjIsLeaf0(p, pFanin) )
                printf( "l " );
            else
                printf( "  " );
        }
        printf( "\n" );
    }
}